

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O1

void __thiscall
VmaVector<VmaJsonWriter::StackItem,_VmaStlAllocator<VmaJsonWriter::StackItem>_>::resize
          (VmaVector<VmaJsonWriter::StackItem,_VmaStlAllocator<VmaJsonWriter::StackItem>_> *this,
          size_t newCount)

{
  VkAllocationCallbacks *pVVar1;
  StackItem *__dest;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = this->m_Capacity;
  uVar3 = uVar2;
  if (uVar2 < newCount) {
    uVar3 = 8;
    if (0xf < uVar2 * 3) {
      uVar3 = uVar2 * 3 >> 1;
    }
    if (uVar3 <= newCount) {
      uVar3 = newCount;
    }
  }
  if (uVar3 != uVar2) {
    if (uVar3 == 0) {
      __dest = (StackItem *)0x0;
    }
    else {
      __dest = (StackItem *)VmaMalloc((this->m_Allocator).m_pCallbacks,uVar3 * 0xc,4);
    }
    uVar2 = this->m_Count;
    if (newCount <= this->m_Count) {
      uVar2 = newCount;
    }
    if (uVar2 != 0) {
      memcpy(__dest,this->m_pArray,uVar2 * 0xc);
    }
    pVVar1 = (this->m_Allocator).m_pCallbacks;
    if ((pVVar1 == (VkAllocationCallbacks *)0x0) || (pVVar1->pfnFree == (PFN_vkFreeFunction)0x0)) {
      free(this->m_pArray);
    }
    else {
      (*pVVar1->pfnFree)(pVVar1->pUserData,this->m_pArray);
    }
    this->m_Capacity = uVar3;
    this->m_pArray = __dest;
  }
  this->m_Count = newCount;
  return;
}

Assistant:

void VmaVector<T, AllocatorT>::resize(size_t newCount)
{
    size_t newCapacity = m_Capacity;
    if (newCount > m_Capacity)
    {
        newCapacity = VMA_MAX(newCount, VMA_MAX(m_Capacity * 3 / 2, (size_t)8));
    }

    if (newCapacity != m_Capacity)
    {
        T* const newArray = newCapacity ? VmaAllocateArray<T>(m_Allocator.m_pCallbacks, newCapacity) : VMA_NULL;
        const size_t elementsToCopy = VMA_MIN(m_Count, newCount);
        if (elementsToCopy != 0)
        {
            memcpy(newArray, m_pArray, elementsToCopy * sizeof(T));
        }
        VmaFree(m_Allocator.m_pCallbacks, m_pArray);
        m_Capacity = newCapacity;
        m_pArray = newArray;
    }

    m_Count = newCount;
}